

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_cmpxchgl_be_riscv32
                   (CPUArchState_conflict23 *env,target_ulong_conflict addr,uint32_t cmpv,
                   uint32_t newv,TCGMemOpIdx oi)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  bool bVar4;
  uintptr_t unaff_retaddr;
  undefined4 local_30;
  uint32_t _old;
  uint32_t ret;
  uint32_t *haddr;
  TCGMemOpIdx oi_local;
  uint32_t newv_local;
  uint32_t cmpv_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict23 *env_local;
  
  puVar3 = (uint32_t *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  local_30 = bswap32(cmpv);
  uVar1 = bswap32(newv);
  LOCK();
  uVar2 = *puVar3;
  bVar4 = local_30 == uVar2;
  if (bVar4) {
    *puVar3 = uVar1;
    uVar2 = local_30;
  }
  UNLOCK();
  if (!bVar4) {
    local_30 = uVar2;
  }
  uVar2 = bswap32(local_30);
  return uVar2;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}